

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_mul(sexp ctx,sexp a,sexp b)

{
  double dVar1;
  sexp a_00;
  sexp psVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  double local_38;
  sexp local_30;
  sexp_gc_var_t local_28;
  
  if (((ulong)a & 3) == 0) {
    uVar4 = 0;
    if ((ulong)a->tag < 0x11) {
      uVar4 = sexp_number_types[a->tag];
    }
  }
  else {
    uVar4 = (uint)a & 1;
  }
  if (((ulong)b & 3) == 0) {
    uVar6 = 0;
    if ((ulong)b->tag < 0x11) {
      uVar6 = sexp_number_types[b->tag];
    }
  }
  else {
    uVar6 = (uint)b & 1;
  }
  local_28.var = &local_30;
  local_30 = (sexp)&DAT_0000043e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  psVar2 = a;
  a_00 = b;
  uVar5 = uVar4;
  if ((int)uVar4 <= (int)uVar6) {
    psVar2 = (sexp)&DAT_0000043e;
    a_00 = a;
    a = b;
    uVar5 = uVar6;
    uVar6 = uVar4;
  }
  uVar5 = uVar5 + uVar6 * 6;
  if (0x23 < uVar5) goto switchD_00119806_caseD_5;
  lVar7 = (long)a_00 >> 1;
  switch(uVar5) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
    psVar2 = sexp_type_exception(ctx,(sexp)0x0,3,a_00);
    break;
  case 7:
    uVar3 = lVar7 * ((long)a >> 1);
    if (SUB168(SEXT816(lVar7) * SEXT816((long)a >> 1),8) + (ulong)(0xbfffffffffffffff < uVar3) <
        (ulong)(uVar3 + 0x4000000000000000 < 0x8000000000000000)) {
      psVar2 = (sexp)(uVar3 * 2 + 1);
    }
    else {
      local_30 = sexp_fixnum_to_bignum(ctx,a_00);
      psVar2 = sexp_mul(ctx,local_30,a);
    }
    break;
  case 8:
    if (a_00 == (sexp)&DAT_00000001) {
      psVar2 = (sexp)&DAT_00000001;
      break;
    }
    local_38 = (double)lVar7;
    goto LAB_00119962;
  case 9:
    uVar3 = (ulong)a_00 >> 1;
    if ((long)a_00 < 0) {
      uVar3 = -lVar7;
    }
    psVar2 = sexp_bignum_fxmul(ctx,(sexp)0x0,a,uVar3,0);
    (psVar2->value).flonum_bits[0] = (a->value).flonum_bits[0] * ((byte)((long)a_00 >> 0x3f) | 1);
    goto LAB_0011993b;
  case 10:
  case 0x16:
    a_00 = sexp_make_ratio(ctx,a_00,(sexp)&DAT_00000003);
    local_30 = a_00;
  case 0x1c:
    psVar2 = sexp_ratio_mul(ctx,a_00,a);
    break;
  case 0xb:
  case 0x11:
  case 0x17:
  case 0x1d:
    a_00 = sexp_make_complex(ctx,a_00,(sexp)&DAT_00000001);
    local_30 = a_00;
  case 0x23:
    psVar2 = sexp_complex_mul(ctx,a_00,a);
    break;
  case 0xe:
    local_38 = (a_00->value).flonum;
LAB_00119962:
    local_38 = local_38 * (a->value).flonum;
LAB_00119968:
    psVar2 = sexp_make_flonum(ctx,local_38);
    break;
  case 0xf:
    local_38 = (a_00->value).flonum;
    dVar1 = sexp_bignum_to_double(a);
    uVar8 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    goto LAB_00119955;
  case 0x10:
    local_38 = (a_00->value).flonum;
    dVar1 = sexp_ratio_to_double(ctx,a);
    uVar8 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
LAB_00119955:
    local_38 = (double)CONCAT44(uVar9,uVar8) * local_38;
    goto LAB_00119968;
  case 0x15:
    psVar2 = sexp_bignum_mul(ctx,(sexp)0x0,a_00,a);
LAB_0011993b:
    psVar2 = sexp_bignum_normalize(psVar2);
  }
switchD_00119806_caseD_5:
  (ctx->value).context.saves = local_28.next;
  return psVar2;
}

Assistant:

sexp sexp_mul (sexp ctx, sexp a, sexp b) {
  sexp_lsint_t prod;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    prod = lsint_mul_sint(lsint_from_sint(sexp_unbox_fixnum(a)), sexp_unbox_fixnum(b));
    if (!lsint_is_fixnum(prod))
      r = sexp_mul(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(lsint_to_sint(prod));
    break;
  case SEXP_NUM_FIX_FLO:
    r = (a==SEXP_ZERO ? a : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)*sexp_flonum_value(b)));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_fxmul(ctx, NULL, b, sexp_unbox_fx_abs(a), 0);
    sexp_bignum_sign(r) = sexp_fx_sign(a) * sexp_bignum_sign(b);
    r = sexp_bignum_normalize(r);
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_mul(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_mul(ctx, NULL, a, b));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) * sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_mul(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_mul(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}